

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QStyleSheetStyle::unsetStyleSheetFont(QStyleSheetStyle *this,QWidget *w)

{
  bool bVar1;
  QFont *pQVar2;
  QWidget *in_RSI;
  QFont *in_RDI;
  long in_FS_OFFSET;
  iterator it;
  type customizedFont;
  Tampered<QFont> *in_stack_ffffffffffffff58;
  Tampered<QFont> *in_stack_ffffffffffffff60;
  iterator *in_stack_ffffffffffffff68;
  QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *local_90;
  Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_>
  *in_stack_ffffffffffffff88;
  Tampered<QFont> *in_stack_ffffffffffffff90;
  piter local_58;
  QWidget *local_48;
  piter in_stack_ffffffffffffffc0;
  QFont local_30 [16];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_>
                *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = in_RSI;
  local_58 = (piter)QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>::find
                              ((QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *)
                               in_stack_ffffffffffffff60,(QWidget **)in_stack_ffffffffffffff58);
  QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>::end
            ((QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *)
             in_stack_ffffffffffffff68);
  bVar1 = QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>::iterator::operator!=
                    (in_stack_ffffffffffffff68,(iterator *)in_stack_ffffffffffffff60);
  if (bVar1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>::iterator::operator*
              ((iterator *)0x42b5e6);
    QStyleSheetStyleCaches::Tampered<QFont>::Tampered
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>::const_iterator::const_iterator
              ((const_iterator *)&stack0xffffffffffffff88,(iterator *)&local_58);
    QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>::erase
              (local_90,(const_iterator)in_stack_ffffffffffffffc0);
    pQVar2 = QWidget::font(local_48);
    QFont::QFont((QFont *)&stack0xffffffffffffffc0,pQVar2);
    QStyleSheetStyleCaches::Tampered<QFont>::reverted
              (in_stack_ffffffffffffff90,(QFont *)in_stack_ffffffffffffff88);
    QWidget::setFont((QWidget *)in_stack_ffffffffffffff88,in_RDI);
    QFont::~QFont(local_30);
    QFont::~QFont((QFont *)&stack0xffffffffffffffc0);
    QStyleSheetStyleCaches::Tampered<QFont>::~Tampered((Tampered<QFont> *)0x42b69b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStyleSheetStyle::unsetStyleSheetFont(QWidget *w) const
{
    const auto it = styleSheetCaches->customFontWidgets.find(w);
    if (it != styleSheetCaches->customFontWidgets.end()) {
        auto customizedFont = std::move(*it);
        styleSheetCaches->customFontWidgets.erase(it);
        w->setFont(std::move(customizedFont).reverted(w->font()));
    }
}